

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyle.cpp
# Opt level: O2

void __thiscall
QCachedPainter::QCachedPainter
          (QCachedPainter *this,QPainter *painter,QString *cachePrefix,QStyleOption *option,
          QSize size,QRect paintRect)

{
  QPixmap *this_00;
  qsizetype qVar1;
  QPainter *pQVar2;
  pointer pQVar3;
  char16_t *pcVar4;
  Data *__p;
  bool bVar5;
  undefined4 uVar6;
  long in_FS_OFFSET;
  qreal dpr;
  QArrayDataPointer<char16_t> local_58;
  QSize local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->m_painter = painter;
  this->m_option = option;
  this_00 = &this->m_pixmap;
  (this->m_pixmapPainter)._M_t.super___uniq_ptr_impl<QPainter,_std::default_delete<QPainter>_>._M_t.
  super__Tuple_impl<0UL,_QPainter_*,_std::default_delete<QPainter>_>.
  super__Head_base<0UL,_QPainter_*,_false>._M_head_impl = (QPainter *)0x0;
  (this->m_pixmapName).d.d = (Data *)0x0;
  (this->m_pixmapName).d.ptr = (char16_t *)0x0;
  (this->m_pixmapName).d.size = 0;
  QPixmap::QPixmap(this_00);
  (this->m_paintRect).x1 = (Representation)paintRect.x1.m_i;
  (this->m_paintRect).y1 = (Representation)paintRect.y1.m_i;
  (this->m_paintRect).x2 = (Representation)paintRect.x2.m_i;
  (this->m_paintRect).y2 = (Representation)paintRect.y2.m_i;
  this->m_pixmapDrawn = false;
  if (size.ht.m_i.m_i < 1 || size.wd.m_i.m_i < 1) {
    size = QRect::size(&option->rect);
  }
  local_40 = size;
  QPainter::device();
  dpr = (qreal)QPaintDevice::devicePixelRatio();
  QStyleHelper::uniqueName((QString *)&local_58,cachePrefix,option,&local_40,dpr);
  pQVar3 = (pointer)(this->m_pixmapName).d.d;
  pcVar4 = (this->m_pixmapName).d.ptr;
  (this->m_pixmapName).d.d = local_58.d;
  (this->m_pixmapName).d.ptr = local_58.ptr;
  qVar1 = (this->m_pixmapName).d.size;
  (this->m_pixmapName).d.size = local_58.size;
  local_58.d = (Data *)pQVar3;
  local_58.ptr = pcVar4;
  local_58.size = qVar1;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  bVar5 = (bool)QPixmapCache::find((QString *)&this->m_pixmapName,(QPixmap *)this_00);
  this->m_alreadyCached = bVar5;
  if (bVar5 == false) {
    styleCachePixmap((QSize *)&local_58,dpr);
    QPixmap::operator=(this_00,(QPixmap *)&local_58);
    QPixmap::~QPixmap((QPixmap *)&local_58);
    std::make_unique<QPainter,QPixmap*>((QPixmap **)&local_58);
    __p = local_58.d;
    local_58.d = (Data *)0x0;
    std::__uniq_ptr_impl<QPainter,_std::default_delete<QPainter>_>::reset
              ((__uniq_ptr_impl<QPainter,_std::default_delete<QPainter>_> *)&this->m_pixmapPainter,
               (pointer)__p);
    std::unique_ptr<QPainter,_std::default_delete<QPainter>_>::~unique_ptr
              ((unique_ptr<QPainter,_std::default_delete<QPainter>_> *)&local_58);
    pQVar2 = (this->m_pixmapPainter)._M_t.
             super___uniq_ptr_impl<QPainter,_std::default_delete<QPainter>_>._M_t.
             super__Tuple_impl<0UL,_QPainter_*,_std::default_delete<QPainter>_>.
             super__Head_base<0UL,_QPainter_*,_false>._M_head_impl;
    uVar6 = QPainter::renderHints();
    QPainter::setRenderHints(pQVar2,uVar6,1);
    QSet<QString>::operator+=(&s_pixmapCacheKeys,&this->m_pixmapName);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QCachedPainter::QCachedPainter(QPainter *painter, const QString &cachePrefix,
                               const QStyleOption *option, QSize size, QRect paintRect)
    : m_painter(painter)
    , m_option(option)
    , m_paintRect(paintRect)
{
    const auto sz = size.isEmpty() ? option->rect.size() : size;
    const qreal dpr = QStyleHelper::getDpr(painter);
    m_pixmapName = QStyleHelper::uniqueName(cachePrefix, option, sz, dpr);
    m_alreadyCached = QPixmapCache::find(m_pixmapName, &m_pixmap);
    if (!m_alreadyCached) {
        m_pixmap = styleCachePixmap(sz, dpr);
        m_pixmapPainter = std::make_unique<QPainter>(&m_pixmap);
        m_pixmapPainter->setRenderHints(painter->renderHints());
        s_pixmapCacheKeys += m_pixmapName;
    }
}